

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O2

Action __thiscall
psy::C::SyntaxDumper::visitGenericSelectionExpression
          (SyntaxDumper *this,GenericSelectionExpressionSyntax *node)

{
  long lVar1;
  GenericSelectionExpressionSyntax *pGVar2;
  GenericSelectionExpressionSyntax aGStack_58 [56];
  
  traverseExpression(this,(ExpressionSyntax *)node);
  GenericSelectionExpressionSyntax::genericKeyword(aGStack_58);
  (**(code **)(*(long *)this + 0x2e8))(this,aGStack_58,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aGStack_58);
  GenericSelectionExpressionSyntax::openParenthesisToken(aGStack_58);
  (**(code **)(*(long *)this + 0x2e8))(this,aGStack_58,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aGStack_58);
  (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(node + 0x38));
  GenericSelectionExpressionSyntax::commaToken(aGStack_58);
  (**(code **)(*(long *)this + 0x2e8))(this,aGStack_58,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aGStack_58);
  pGVar2 = node + 0x48;
  while (lVar1 = *(long *)pGVar2, lVar1 != 0) {
    (**(code **)(*(long *)this + 0x2f0))(this,*(undefined8 *)(lVar1 + 8));
    psy::C::SyntaxNodeSeparatedList<psy::C::GenericAssociationSyntax*>::delimiterToken();
    (**(code **)(*(long *)this + 0x2e8))(this,aGStack_58,node);
    psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aGStack_58);
    pGVar2 = (GenericSelectionExpressionSyntax *)(lVar1 + 0x10);
  }
  GenericSelectionExpressionSyntax::closeParenthesisToken(aGStack_58);
  (**(code **)(*(long *)this + 0x2e8))(this,aGStack_58,node);
  psy::C::SyntaxToken::~SyntaxToken((SyntaxToken *)aGStack_58);
  return Skip;
}

Assistant:

virtual Action visitGenericSelectionExpression(const GenericSelectionExpressionSyntax*  node) override
    {
        traverseExpression(node);
        terminal(node->genericKeyword(), node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->expression());
        terminal(node->commaToken(), node);
        for (auto it = node->associations(); it; it = it->next) {
            nonterminal(it->value);
            terminal(it->delimiterToken(), node);
        }
        terminal(node->closeParenthesisToken(), node);
        return Action::Skip;
    }